

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cc
# Opt level: O1

Status * __thiscall
draco::Decoder::DecodeBufferToGeometry
          (Status *__return_storage_ptr__,Decoder *this,DecoderBuffer *in_buffer,Mesh *out_geometry)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *psVar2;
  pointer pcVar3;
  unique_ptr<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>_> this_00;
  Status *_local_status;
  StatusOr<std::unique_ptr<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>_>_>
  _statusor122;
  DracoHeader header;
  DecoderBuffer temp_buffer;
  StatusOr<std::unique_ptr<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>_>_> local_a8;
  DracoHeader local_74;
  DecoderBuffer local_68;
  
  local_68.bit_mode_ = in_buffer->bit_mode_;
  local_68._49_1_ = in_buffer->field_0x31;
  local_68.bitstream_version_ = in_buffer->bitstream_version_;
  local_68._52_4_ = *(undefined4 *)&in_buffer->field_0x34;
  local_68.data_ = in_buffer->data_;
  local_68.data_size_ = in_buffer->data_size_;
  local_68.pos_ = in_buffer->pos_;
  local_68.bit_decoder_.bit_buffer_ = (in_buffer->bit_decoder_).bit_buffer_;
  local_68.bit_decoder_.bit_buffer_end_ = (in_buffer->bit_decoder_).bit_buffer_end_;
  local_68.bit_decoder_.bit_offset_ = (in_buffer->bit_decoder_).bit_offset_;
  PointCloudDecoder::DecodeHeader(__return_storage_ptr__,&local_68,&local_74);
  if (__return_storage_ptr__->code_ == OK) {
    pcVar3 = (__return_storage_ptr__->error_msg_)._M_dataplus._M_p;
    paVar1 = &(__return_storage_ptr__->error_msg_).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar1) {
      operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
    }
    psVar2 = &__return_storage_ptr__->error_msg_;
    if (local_74.encoder_type == '\x01') {
      CreateMeshDecoder(&local_a8,local_74.encoder_method);
      this_00._M_t.
      super___uniq_ptr_impl<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>_>._M_t.
      super__Tuple_impl<0UL,_draco::MeshDecoder_*,_std::default_delete<draco::MeshDecoder>_>.
      super__Head_base<0UL,_draco::MeshDecoder_*,_false>._M_head_impl =
           (__uniq_ptr_data<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>,_true,_true>
           )(__uniq_ptr_data<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>,_true,_true>
             )local_a8.value_;
      if (local_a8.status_.code_ == OK) {
        local_a8.value_._M_t.
        super___uniq_ptr_impl<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>_>._M_t.
        super__Tuple_impl<0UL,_draco::MeshDecoder_*,_std::default_delete<draco::MeshDecoder>_>.
        super__Head_base<0UL,_draco::MeshDecoder_*,_false>._M_head_impl =
             (__uniq_ptr_data<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>,_true,_true>
              )(__uniq_ptr_impl<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>_>)0x0;
        MeshDecoder::Decode(__return_storage_ptr__,
                            (MeshDecoder *)
                            this_00._M_t.
                            super___uniq_ptr_impl<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_draco::MeshDecoder_*,_std::default_delete<draco::MeshDecoder>_>
                            .super__Head_base<0UL,_draco::MeshDecoder_*,_false>._M_head_impl,
                            &this->options_,in_buffer,out_geometry);
        if (__return_storage_ptr__->code_ == OK) {
          pcVar3 = (psVar2->_M_dataplus)._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar3 != paVar1) {
            operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
          }
          __return_storage_ptr__->code_ = OK;
          (__return_storage_ptr__->error_msg_)._M_dataplus._M_p = (pointer)paVar1;
          (__return_storage_ptr__->error_msg_)._M_string_length = 0;
          (__return_storage_ptr__->error_msg_).field_2._M_local_buf[0] = '\0';
        }
        (*((PointCloudDecoder *)
          this_00._M_t.
          super___uniq_ptr_impl<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>_>._M_t.
          super__Tuple_impl<0UL,_draco::MeshDecoder_*,_std::default_delete<draco::MeshDecoder>_>.
          super__Head_base<0UL,_draco::MeshDecoder_*,_false>._M_head_impl)->_vptr_PointCloudDecoder
          [1])();
      }
      else {
        __return_storage_ptr__->code_ = local_a8.status_.code_;
        (__return_storage_ptr__->error_msg_)._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)psVar2,local_a8.status_.error_msg_._M_dataplus._M_p,
                   local_a8.status_.error_msg_._M_dataplus._M_p +
                   local_a8.status_.error_msg_._M_string_length);
      }
      if ((_Head_base<0UL,_draco::MeshDecoder_*,_false>)
          local_a8.value_._M_t.
          super___uniq_ptr_impl<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>_>._M_t.
          super__Tuple_impl<0UL,_draco::MeshDecoder_*,_std::default_delete<draco::MeshDecoder>_>.
          super__Head_base<0UL,_draco::MeshDecoder_*,_false>._M_head_impl !=
          (_Head_base<0UL,_draco::MeshDecoder_*,_false>)0x0) {
        (*((PointCloudDecoder *)
          local_a8.value_._M_t.
          super___uniq_ptr_impl<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>_>._M_t.
          super__Tuple_impl<0UL,_draco::MeshDecoder_*,_std::default_delete<draco::MeshDecoder>_>.
          super__Head_base<0UL,_draco::MeshDecoder_*,_false>._M_head_impl)->_vptr_PointCloudDecoder
          [1])();
      }
      local_a8.value_._M_t.
      super___uniq_ptr_impl<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>_>._M_t.
      super__Tuple_impl<0UL,_draco::MeshDecoder_*,_std::default_delete<draco::MeshDecoder>_>.
      super__Head_base<0UL,_draco::MeshDecoder_*,_false>._M_head_impl =
           (__uniq_ptr_data<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>,_true,_true>
           )(__uniq_ptr_impl<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>_>)0x0;
      local_a8.status_.error_msg_._M_string_length =
           local_a8.status_.error_msg_.field_2._M_allocated_capacity;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8.status_.error_msg_._M_dataplus._M_p == &local_a8.status_.error_msg_.field_2)
      goto LAB_00124a1f;
    }
    else {
      local_a8.status_._0_8_ = (pointer)((long)&local_a8 + 0x10U);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"Input is not a mesh.","")
      ;
      __return_storage_ptr__->code_ = DRACO_ERROR;
      (__return_storage_ptr__->error_msg_)._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)psVar2,local_a8.status_._0_8_,
                 local_a8.status_.error_msg_._M_dataplus._M_p + local_a8.status_._0_8_);
      local_a8.status_.error_msg_._M_dataplus._M_p = (pointer)local_a8.status_._0_8_;
      if ((pointer)local_a8.status_._0_8_ == (pointer)((long)&local_a8 + 0x10U)) goto LAB_00124a1f;
    }
    operator_delete(local_a8.status_.error_msg_._M_dataplus._M_p,
                    local_a8.status_.error_msg_._M_string_length + 1);
  }
LAB_00124a1f:
  DecoderBuffer::BitDecoder::~BitDecoder(&local_68.bit_decoder_);
  return __return_storage_ptr__;
}

Assistant:

Status Decoder::DecodeBufferToGeometry(DecoderBuffer *in_buffer,
                                       Mesh *out_geometry) {
#ifdef DRACO_MESH_COMPRESSION_SUPPORTED
  DecoderBuffer temp_buffer(*in_buffer);
  DracoHeader header;
  DRACO_RETURN_IF_ERROR(PointCloudDecoder::DecodeHeader(&temp_buffer, &header))
  if (header.encoder_type != TRIANGULAR_MESH) {
    return Status(Status::DRACO_ERROR, "Input is not a mesh.");
  }
  DRACO_ASSIGN_OR_RETURN(std::unique_ptr<MeshDecoder> decoder,
                         CreateMeshDecoder(header.encoder_method))

  DRACO_RETURN_IF_ERROR(decoder->Decode(options_, in_buffer, out_geometry))
  return OkStatus();
#else
  return Status(Status::DRACO_ERROR, "Unsupported geometry type.");
#endif
}